

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell-interface.h
# Opt level: O0

bool __thiscall
wasm::ShellExternalInterface::growMemory
          (ShellExternalInterface *this,Name memoryName,Address param_2,Address newSize)

{
  bool bVar1;
  address64_t aVar2;
  pointer ppVar3;
  Memory *memory;
  _Self local_40;
  iterator it;
  ShellExternalInterface *this_local;
  Address newSize_local;
  Address param_2_local;
  Name memoryName_local;
  
  param_2_local.addr = memoryName.super_IString.str._M_len;
  it._M_node = (_Base_ptr)this;
  this_local = (ShellExternalInterface *)newSize.addr;
  newSize_local = param_2;
  aVar2 = Address::operator_cast_to_unsigned_long((Address *)&this_local);
  if (aVar2 < 0x40000001) {
    local_40._M_node =
         (_Base_ptr)
         std::
         map<wasm::Name,_wasm::ShellExternalInterface::Memory,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::ShellExternalInterface::Memory>_>_>
         ::find(&this->memories,(key_type *)&param_2_local);
    memory = (Memory *)
             std::
             map<wasm::Name,_wasm::ShellExternalInterface::Memory,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::ShellExternalInterface::Memory>_>_>
             ::end(&this->memories);
    bVar1 = std::operator==(&local_40,(_Self *)&memory);
    if (bVar1) {
      (*(this->super_ExternalInterface)._vptr_ExternalInterface[8])
                (this,"growMemory on non-existing memory");
    }
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_wasm::Name,_wasm::ShellExternalInterface::Memory>_>::
             operator->(&local_40);
    aVar2 = Address::operator_cast_to_unsigned_long((Address *)&this_local);
    Memory::resize(&ppVar3->second,aVar2);
    memoryName_local.super_IString.str._M_str._7_1_ = true;
  }
  else {
    memoryName_local.super_IString.str._M_str._7_1_ = false;
  }
  return memoryName_local.super_IString.str._M_str._7_1_;
}

Assistant:

bool
  growMemory(Name memoryName, Address /*oldSize*/, Address newSize) override {
    // Apply a reasonable limit on memory size, 1GB, to avoid DOS on the
    // interpreter.
    if (newSize > 1024 * 1024 * 1024) {
      return false;
    }
    auto it = memories.find(memoryName);
    if (it == memories.end()) {
      trap("growMemory on non-existing memory");
    }
    auto& memory = it->second;
    memory.resize(newSize);
    return true;
  }